

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  undefined2 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  BIT_DStream_t bitD;
  
  sVar3 = BIT_initDStream(&bitD,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar3) {
    return sVar3;
  }
  puVar4 = (undefined2 *)((~((long)dstSize >> 0x3f) & dstSize) + (long)dst);
  uVar7 = *DTable;
  iVar10 = (int)bitD.start;
  if ((long)dstSize < 8) {
    uVar11 = (ulong)bitD.bitsConsumed;
    if (uVar11 < 0x41) {
      if (bitD.ptr < bitD.limitPtr) {
        if (bitD.ptr == bitD.start) goto LAB_01bfc760;
        uVar11 = (ulong)(uint)((int)bitD.ptr - iVar10);
        if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
          uVar11 = (ulong)(bitD.bitsConsumed >> 3);
        }
        bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar11 * -8;
      }
      else {
        uVar11 = (ulong)(bitD.bitsConsumed >> 3);
        bitD.bitsConsumed = bitD.bitsConsumed & 7;
      }
      bitD.ptr = bitD.ptr + -uVar11;
      uVar11 = (ulong)bitD.bitsConsumed;
      bitD.bitContainer = *(BitContainerType *)bitD.ptr;
    }
    else {
      bitD.ptr = "";
    }
  }
  else {
    uVar9 = -(uVar7 >> 0x10) & 0x3f;
    uVar11 = (ulong)bitD.bitsConsumed;
    if ((uVar7 & 0xfc0000) < 0xc0000) {
      while (bitD.bitsConsumed = (uint)uVar11, bitD.bitsConsumed < 0x41) {
        if (bitD.ptr < bitD.limitPtr) {
          if (bitD.ptr == bitD.start) goto LAB_01bfc72f;
          bVar13 = bitD.start <= (char *)((long)bitD.ptr - (uVar11 >> 3));
          uVar6 = (int)bitD.ptr - iVar10;
          if (bVar13) {
            uVar6 = (uint)(uVar11 >> 3);
          }
          uVar5 = bitD.bitsConsumed + uVar6 * -8;
        }
        else {
          uVar6 = (uint)(uVar11 >> 3);
          uVar5 = bitD.bitsConsumed & 7;
          bVar13 = true;
        }
        uVar11 = (ulong)uVar5;
        bitD.ptr = (char *)((long)bitD.ptr - (ulong)uVar6);
        bitD.bitContainer = *(BitContainerType *)bitD.ptr;
        if (((undefined2 *)((long)puVar4 - 9U) <= dst) || (!bVar13)) goto LAB_01bfc72f;
        uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar9;
        *(short *)dst = (short)DTable[uVar11 + 1];
        uVar5 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar5;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        uVar8 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar11) = (short)DTable[uVar8 + 1];
        uVar5 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar5;
        uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        lVar1 = uVar8 + uVar11;
        uVar12 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar8 + uVar11) = (short)DTable[uVar12 + 1];
        uVar5 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar5;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
        lVar2 = uVar11 + lVar1;
        uVar8 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar11 + lVar1) = (short)DTable[uVar8 + 1];
        uVar5 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar5;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        uVar8 = (bitD.bitContainer << ((ulong)uVar5 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar11 + lVar2) = (short)DTable[uVar8 + 1];
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + uVar11 + lVar2);
        uVar11 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar5);
      }
      bitD.ptr = "";
    }
    else {
      while (bitD.bitsConsumed = (uint)uVar11, bitD.bitsConsumed < 0x41) {
        if (bitD.ptr < bitD.limitPtr) {
          if (bitD.ptr == bitD.start) goto LAB_01bfc72f;
          bVar13 = bitD.start <= (char *)((long)bitD.ptr - (uVar11 >> 3));
          uVar8 = (ulong)(uint)((int)bitD.ptr - iVar10);
          if (bVar13) {
            uVar8 = uVar11 >> 3;
          }
          uVar6 = bitD.bitsConsumed + (int)uVar8 * -8;
        }
        else {
          uVar8 = uVar11 >> 3;
          uVar6 = bitD.bitsConsumed & 7;
          bVar13 = true;
        }
        uVar11 = (ulong)uVar6;
        bitD.ptr = (char *)((long)bitD.ptr - uVar8);
        bitD.bitContainer = *(BitContainerType *)bitD.ptr;
        if (((undefined2 *)((long)puVar4 - 7U) <= dst) || (!bVar13)) goto LAB_01bfc72f;
        uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar9;
        *(short *)dst = (short)DTable[uVar11 + 1];
        uVar6 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar6;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        uVar8 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar11) = (short)DTable[uVar8 + 1];
        uVar6 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar6;
        uVar12 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        lVar1 = uVar12 + uVar11;
        uVar8 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar12 + uVar11) = (short)DTable[uVar8 + 1];
        uVar6 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar6;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        uVar8 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar9;
        *(short *)((long)dst + uVar11 + lVar1) = (short)DTable[uVar8 + 1];
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + uVar11 + lVar1);
        uVar11 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar6);
      }
      bitD.ptr = "";
    }
  }
LAB_01bfc760:
  if (1 < (ulong)((long)puVar4 - (long)dst)) {
    uVar9 = -(uVar7 >> 0x10) & 0x3f;
    while (uVar6 = (uint)uVar11, uVar6 < 0x41) {
      if (bitD.ptr < bitD.limitPtr) {
        if (bitD.ptr == bitD.start) goto LAB_01bfc862;
        bVar13 = bitD.start <= bitD.ptr + -(uVar11 >> 3);
        uVar8 = (ulong)(uint)((int)bitD.ptr - iVar10);
        if (bVar13) {
          uVar8 = uVar11 >> 3;
        }
        bitD.bitsConsumed = uVar6 + (int)uVar8 * -8;
      }
      else {
        uVar8 = uVar11 >> 3;
        bitD.bitsConsumed = uVar6 & 7;
        bVar13 = true;
      }
      bitD.ptr = bitD.ptr + -uVar8;
      uVar11 = (ulong)bitD.bitsConsumed;
      bitD.bitContainer = *(BitContainerType *)bitD.ptr;
      if ((puVar4 + -1 < dst) || (!bVar13)) goto LAB_01bfc862;
      uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar9;
      *(short *)dst = (short)DTable[uVar11 + 1];
      bitD.bitsConsumed = *(byte *)((long)DTable + uVar11 * 4 + 6) + bitD.bitsConsumed;
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7));
      uVar11 = (ulong)bitD.bitsConsumed;
    }
    bitD.ptr = "";
LAB_01bfc862:
    for (; dst <= puVar4 + -1;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7))) {
      uVar8 = (bitD.bitContainer << (uVar11 & 0x3f)) >> uVar9;
      *(short *)dst = (short)DTable[uVar8 + 1];
      bitD.bitsConsumed = *(byte *)((long)DTable + uVar8 * 4 + 6) + bitD.bitsConsumed;
      uVar11 = (ulong)bitD.bitsConsumed;
    }
  }
  uVar9 = (uint)uVar11;
  if (dst < puVar4) {
    uVar11 = (bitD.bitContainer << (uVar11 & 0x3f)) >> ((ulong)(byte)-(char)(uVar7 >> 0x10) & 0x3f);
    *(char *)dst = (char)DTable[uVar11 + 1];
    if (*(char *)((long)DTable + uVar11 * 4 + 7) == '\x01') {
      uVar9 = *(byte *)((long)DTable + uVar11 * 4 + 6) + bitD.bitsConsumed;
    }
    else {
      uVar9 = bitD.bitsConsumed;
      if (bitD.bitsConsumed < 0x40) {
        uVar7 = bitD.bitsConsumed + *(byte *)((long)DTable + uVar11 * 4 + 6);
        uVar9 = 0x40;
        if (uVar7 < 0x40) {
          uVar9 = uVar7;
        }
      }
    }
  }
  if (uVar9 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (bitD.ptr != bitD.start) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
LAB_01bfc72f:
  bitD.bitsConsumed = (uint)uVar11;
  goto LAB_01bfc760;
}

Assistant:

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}